

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boing.c
# Opt level: O1

void reshape(GLFWwindow *window,int w,int h)

{
  int i;
  float *pfVar1;
  long lVar2;
  long lVar3;
  float p;
  float fVar4;
  vec3 f;
  vec3 center;
  vec4 r;
  vec4 t;
  mat4x4 view;
  mat4x4 projection;
  float local_130 [10];
  float local_108;
  undefined4 uStack_104;
  undefined4 uStack_100;
  undefined4 uStack_fc;
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  float afStack_c8 [4];
  float local_b8 [5];
  float local_a4;
  float local_a0;
  undefined4 local_9c;
  float local_98;
  float local_94;
  float local_90;
  undefined4 local_8c;
  float local_88;
  float local_84;
  float local_80;
  undefined8 local_7c;
  undefined8 uStack_74;
  undefined4 local_6c;
  float local_68 [18];
  
  lVar3 = 0;
  (*glad_glViewport)(0,0,w,h);
  (*glad_glMatrixMode)(0x1701);
  local_68[0] = 2.857143 / ((float)w / (float)h);
  local_68[1] = 0.0;
  local_68[2] = 0.0;
  local_68[3] = 0.0;
  local_68[4] = 0.0;
  local_68[5] = 2.857143;
  local_68[6] = 0.0;
  local_68[7] = 0.0;
  local_68[8] = 0.0;
  local_68[9] = 0.0;
  local_68[10] = -1.003125;
  local_68[0xb] = -1.0;
  local_68[0xc] = 0.0;
  local_68[0xd] = 0.0;
  local_68[0xe] = -2.003125;
  local_68[0xf] = 0.0;
  (*glad_glLoadMatrixf)(local_68);
  (*glad_glMatrixMode)(0x1700);
  local_130[8] = 0.0;
  local_130[6] = 0.0;
  local_130[7] = 0.0;
  do {
    *(float *)((long)local_130 + lVar3 + 0xc) =
         *(float *)((long)local_130 + lVar3 + 0x18) - *(float *)((long)&DAT_00123100 + lVar3);
    lVar3 = lVar3 + 4;
  } while (lVar3 != 0xc);
  fVar4 = 0.0;
  lVar3 = 0;
  do {
    fVar4 = fVar4 + local_130[lVar3 + 3] * local_130[lVar3 + 3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  if (fVar4 < 0.0) {
    fVar4 = sqrtf(fVar4);
  }
  else {
    fVar4 = SQRT(fVar4);
  }
  lVar3 = 0;
  do {
    local_130[lVar3 + 3] = local_130[lVar3 + 3] * (1.0 / fVar4);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  fVar4 = 0.0;
  local_130[0] = local_130[4] * 0.0 + local_130[5];
  local_130[1] = local_130[5] * 0.0 + local_130[3] * -0.0;
  local_130[2] = local_130[4] * -0.0 - local_130[3];
  lVar3 = 0;
  do {
    fVar4 = fVar4 + local_130[lVar3] * local_130[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  if (fVar4 < 0.0) {
    local_d8 = ZEXT416((uint)local_130[3]);
    local_e8 = ZEXT416((uint)local_130[5]);
    local_f8 = ZEXT416((uint)local_130[4]);
    uStack_104 = 0x80000000;
    uStack_100 = 0x80000000;
    uStack_fc = 0x80000000;
    local_108 = -local_130[3];
    fVar4 = sqrtf(fVar4);
    local_130[4] = (float)local_f8._0_4_;
    local_130[3] = (float)local_d8._0_4_;
    local_130[5] = (float)local_e8._0_4_;
    local_a0 = local_108;
  }
  else {
    fVar4 = SQRT(fVar4);
    local_a0 = -local_130[3];
  }
  lVar3 = 0;
  do {
    local_130[lVar3] = local_130[lVar3] * (1.0 / fVar4);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  pfVar1 = local_b8 + 4;
  local_b8[4] = local_130[0];
  local_a4 = local_130[1] * local_130[5] - local_130[4] * local_130[2];
  lVar3 = 0;
  local_9c = 0;
  local_98 = local_130[1];
  local_94 = local_130[2] * local_130[3] - local_130[5] * local_130[0];
  local_90 = -local_130[4];
  local_8c = 0;
  local_88 = local_130[2];
  local_84 = local_130[0] * local_130[4] - local_130[3] * local_130[1];
  local_80 = -local_130[5];
  local_7c = 0;
  uStack_74 = 0;
  local_6c = 0x3f800000;
  local_b8[0] = -0.0;
  local_b8[1] = -0.0;
  local_b8[2] = -641.0;
  local_b8[3] = 0.0;
  do {
    lVar2 = 0;
    do {
      *(float *)((long)afStack_c8 + lVar2) = pfVar1[lVar2];
      lVar2 = lVar2 + 4;
    } while (lVar2 != 0x10);
    fVar4 = 0.0;
    lVar2 = 0;
    do {
      fVar4 = fVar4 + local_b8[lVar2] * afStack_c8[lVar2];
      lVar2 = lVar2 + 1;
    } while (lVar2 != 4);
    *(float *)((long)&local_7c + lVar3 * 4 + 4) =
         fVar4 + *(float *)((long)&local_7c + lVar3 * 4 + 4);
    lVar3 = lVar3 + 1;
    pfVar1 = pfVar1 + 1;
  } while (lVar3 != 4);
  (*glad_glLoadMatrixf)(local_b8 + 4);
  return;
}

Assistant:

void reshape( GLFWwindow* window, int w, int h )
{
   mat4x4 projection, view;

   glViewport( 0, 0, (GLsizei)w, (GLsizei)h );

   glMatrixMode( GL_PROJECTION );
   mat4x4_perspective( projection,
                       2.f * (float) atan2( RADIUS, 200.f ),
                       (float)w / (float)h,
                       1.f, VIEW_SCENE_DIST );
   glLoadMatrixf((const GLfloat*) projection);

   glMatrixMode( GL_MODELVIEW );
   {
      vec3 eye = { 0.f, 0.f, VIEW_SCENE_DIST };
      vec3 center = { 0.f, 0.f, 0.f };
      vec3 up = { 0.f, -1.f, 0.f };
      mat4x4_look_at( view, eye, center, up );
   }
   glLoadMatrixf((const GLfloat*) view);
}